

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderDNA.h
# Opt level: O2

void __thiscall Assimp::Blender::Scene::Scene(Scene *this)

{
  (this->super_ElemBase).dna_type = (char *)0x0;
  (this->super_ElemBase)._vptr_ElemBase = (_func_int **)&PTR__Scene_0075cdb0;
  (this->id).super_ElemBase.dna_type = (char *)0x0;
  (this->id).super_ElemBase._vptr_ElemBase = (_func_int **)&PTR__ElemBase_0075cde8;
  (this->base).super_ElemBase.dna_type = (char *)0x0;
  (this->camera).super___shared_ptr<Assimp::Blender::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->camera).super___shared_ptr<Assimp::Blender::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->world).super___shared_ptr<Assimp::Blender::World,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->world).super___shared_ptr<Assimp::Blender::World,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->basact).super___shared_ptr<Assimp::Blender::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->basact).super___shared_ptr<Assimp::Blender::Base,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->base).super_ElemBase._vptr_ElemBase = (_func_int **)&PTR__ListBase_0075ce20;
  (this->base).first.super___shared_ptr<Assimp::Blender::ElemBase,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->base).first.super___shared_ptr<Assimp::Blender::ElemBase,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->base).last.super___shared_ptr<Assimp::Blender::ElemBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (this->base).last.super___shared_ptr<Assimp::Blender::ElemBase,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  return;
}

Assistant:

ElemBase()
    : dna_type(nullptr)
    {
        // empty
    }